

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.cpp
# Opt level: O3

shared_ptr<mocker::ast::Type> __thiscall
mocker::ir::BuilderContext::getExprType(BuilderContext *this,NodeID id)

{
  _List_node_base *p_Var1;
  const_iterator cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Type> sVar3;
  key_type local_10;
  
  cVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(*(_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   **)(id + 0x58),&local_10);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    *(undefined8 *)&this->logicalExprInfo =
         *(undefined8 *)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_false>
                 ._M_cur + 0x10);
    p_Var1 = *(_List_node_base **)
              ((long)cVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_false>
                     ._M_cur + 0x18);
    (this->logicalExprInfo).trueNext._M_node = p_Var1;
    if (p_Var1 != (_List_node_base *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_prev = *(int *)&p_Var1->_M_prev + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_prev = *(int *)&p_Var1->_M_prev + 1;
      }
    }
    sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ast::Type>)
           sVar3.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

const std::shared_ptr<ast::Type>
BuilderContext::getExprType(ast::NodeID id) const {
  return exprType.at(id);
}